

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

void __thiscall
iDynTree::AttitudeQuaternionEKF::serializeMeasurementVector(AttitudeQuaternionEKF *this)

{
  long lVar1;
  undefined8 *puVar2;
  long in_RDI;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff78;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
  *in_stack_ffffffffffffff80;
  undefined8 uVar3;
  Index in_stack_ffffffffffffff90;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff98;
  
  lVar1 = iDynTree::VectorDynSize::size();
  if (lVar1 != *(long *)(in_RDI + 0x3e0)) {
    iDynTree::VectorDynSize::resize(in_RDI + 0x398);
  }
  toEigen<3U>((VectorFixSize<3U> *)in_stack_ffffffffffffff98);
  toEigen((VectorDynSize *)in_stack_ffffffffffffff98);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::block<3,1>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RDI);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,3,1,false>::
  operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if ((*(byte *)(in_RDI + 0x2d8) & 1) != 0) {
    uVar3 = *(undefined8 *)(in_RDI + 0x370);
    puVar2 = (undefined8 *)iDynTree::VectorDynSize::operator()((VectorDynSize *)(in_RDI + 0x398),3);
    *puVar2 = uVar3;
  }
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::serializeMeasurementVector()
{
    using iDynTree::toEigen;
    if (m_y.size() != m_output_size)
    {
        m_y.resize(m_output_size);
    }

    toEigen(m_y).block<3, 1>(0, 0) = toEigen(m_Acc_y);
    if (m_params_qekf.use_magnetometer_measurements)
    {
        m_y(3) = m_Mag_y;
    }
}